

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeRet(RACFGBuilder *this,FuncRetNode *funcRet)

{
  byte bVar1;
  long lVar2;
  BaseBuilder *pBVar3;
  Environment vReg;
  uint uVar4;
  Error EVar5;
  uint uVar6;
  InstId IVar7;
  long lVar8;
  RAWorkReg *workReg;
  Reg src;
  RAWorkReg *local_60;
  Operand_ local_58;
  Operand_ local_48;
  
  lVar2 = *(long *)(*(long *)this + 0x98);
  bVar1 = funcRet->field_0x12;
  *(undefined8 *)(*(long *)(this + 8) + 0x198) = *(undefined8 *)funcRet;
  if (bVar1 != 0) {
    lVar8 = 0;
    do {
      if (lVar8 == 0x10) {
        onBeforeRet();
        return 0x1e;
      }
      if ((((*(uint *)(&funcRet->field_0x40 + lVar8 * 4) & 7) == 1) &&
          (*(char *)(lVar2 + 0xc3 + lVar8) == '\x16')) &&
         (uVar4 = *(int *)(&funcRet->field_0x44 + lVar8 * 4) - 0x100, uVar4 < 0xfffffeff)) {
        pBVar3 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
        if (*(uint *)&pBVar3[1].super_BaseEmitter._logger <= uVar4) {
          return 0x1e;
        }
        vReg = (&(pBVar3[1].super_BaseEmitter._code)->_environment)[uVar4];
        local_60 = *(RAWorkReg **)((long)vReg + 0x28);
        if ((local_60 == (RAWorkReg *)0x0) &&
           (EVar5 = BaseRAPass::_asWorkReg(*(BaseRAPass **)this,(VirtReg *)vReg,&local_60),
           EVar5 != 0)) {
          return EVar5;
        }
        local_58._signature._bits = *(uint32_t *)(local_60 + 0x20);
        if ((local_58._signature._bits & 0xf00) != 0x100) {
          return 0x19;
        }
        local_58._baseId = *(uint32_t *)(local_60 + 4);
        local_58._data[0] = 0;
        local_58._data[1] = 0;
        local_48._signature._bits = 2;
        local_48._baseId = 0;
        local_48._data[0] = 0;
        local_48._data[1] = 0;
        uVar4 = *(uint *)(lVar2 + 0xc0 + lVar8);
        uVar6 = (uint)(byte)TypeUtils::_typeData[*(byte *)(*(long *)(local_60 + 8) + 0xd)];
        if ((char)uVar4 != '\0') {
          uVar6 = uVar4;
        }
        if ((char)uVar6 == '+') {
          EVar5 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_48,8,4);
          if (EVar5 != 0) {
            return EVar5;
          }
          local_48._signature._bits._3_1_ = 8;
          IVar7 = 0x4c1;
          if (this[0x292] == (RACFGBuilder)0x0) {
            IVar7 = 0x1d6;
          }
          EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar7,&local_48,&local_58);
          if (EVar5 != 0) {
            return EVar5;
          }
          EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0xe2,&local_48);
        }
        else {
          if ((uVar6 & 0xff) != 0x2a) {
            return 0x19;
          }
          EVar5 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_48,4,4);
          if (EVar5 != 0) {
            return EVar5;
          }
          local_48._signature._bits._3_1_ = 4;
          IVar7 = 0x4c5;
          if (this[0x292] == (RACFGBuilder)0x0) {
            IVar7 = 0x1d9;
          }
          EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar7,&local_48,&local_58);
          if (EVar5 != 0) {
            return EVar5;
          }
          EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0xe2,&local_48);
        }
        if (EVar5 != 0) {
          return EVar5;
        }
      }
      lVar8 = lVar8 + 4;
    } while ((ulong)bVar1 * 4 != lVar8);
  }
  return 0;
}

Assistant:

Error RACFGBuilder::onBeforeRet(FuncRetNode* funcRet) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  cc()->_setCursor(funcRet->prev());

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    const FuncValue& ret = funcDetail.ret(i);

    if (!op.isReg())
      continue;

    if (ret.regType() == RegType::kX86_St) {
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        if (workReg->group() != RegGroup::kVec)
          return DebugUtils::errored(kErrorInvalidAssignment);

        Reg src(workReg->signature(), workReg->virtId());
        Mem mem;

        TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
        if (ret.hasTypeId())
          typeId = ret.typeId();

        switch (typeId) {
          case TypeId::kFloat32:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
            mem.setSize(4);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          case TypeId::kFloat64:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
            mem.setSize(8);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          default:
            return DebugUtils::errored(kErrorInvalidAssignment);
        }
      }
    }
  }

  return kErrorOk;
}